

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSign.c
# Opt level: O0

double * Cudd_CofMinterm(DdManager *dd,DdNode *node)

{
  st__table *table_00;
  double *__ptr;
  int local_4c;
  int local_44;
  int local_40;
  int local_3c;
  int firstLevel;
  int i;
  double *result;
  double *values;
  st__table *table;
  DdNode *node_local;
  DdManager *dd_local;
  
  _firstLevel = (DdManager *)0x0;
  table_00 = st__init_table(st__ptrcmp,st__ptrhash);
  if (table_00 == (st__table *)0x0) {
    fprintf((FILE *)dd->err,"out-of-memory, couldn\'t measure DD cofactors.\n");
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local = (DdManager *)0x0;
  }
  else {
    size = dd->size;
    __ptr = ddCofMintermAux(dd,node,table_00);
    if (__ptr != (double *)0x0) {
      _firstLevel = (DdManager *)malloc((long)(size + 1) << 3);
      if (_firstLevel == (DdManager *)0x0) {
        dd->errorCode = CUDD_MEMORY_OUT;
      }
      else {
        if (*(int *)((ulong)node & 0xfffffffffffffffe) == 0x7fffffff) {
          local_40 = 1;
        }
        else {
          if (*(int *)((ulong)node & 0xfffffffffffffffe) == 0x7fffffff) {
            local_44 = *(int *)((ulong)node & 0xfffffffffffffffe);
          }
          else {
            local_44 = dd->perm[*(uint *)((ulong)node & 0xfffffffffffffffe)];
          }
          local_40 = local_44;
        }
        for (local_3c = 0; local_3c < size; local_3c = local_3c + 1) {
          if (*(int *)((ulong)node & 0xfffffffffffffffe) == 0x7fffffff) {
            local_4c = *(int *)((ulong)node & 0xfffffffffffffffe);
          }
          else {
            local_4c = dd->perm[*(uint *)((ulong)node & 0xfffffffffffffffe)];
          }
          if (local_3c < local_4c) {
            *(double *)(&(_firstLevel->sentinel).index + (long)dd->invperm[local_3c] * 2) =
                 __ptr[size - local_40];
          }
          else {
            *(double *)(&(_firstLevel->sentinel).index + (long)dd->invperm[local_3c] * 2) =
                 __ptr[local_3c - local_40];
          }
        }
        *(double *)(&(_firstLevel->sentinel).index + (long)size * 2) = __ptr[size - local_40];
      }
    }
    if ((*(int *)(((ulong)node & 0xfffffffffffffffe) + 4) == 1) && (__ptr != (double *)0x0)) {
      free(__ptr);
    }
    st__foreach(table_00,cuddStCountfree,(char *)0x0);
    st__free_table(table_00);
    if (_firstLevel == (DdManager *)0x0) {
      fprintf((FILE *)dd->out,"out-of-memory, couldn\'t measure DD cofactors.\n");
      dd->errorCode = CUDD_MEMORY_OUT;
    }
    dd_local = _firstLevel;
  }
  return (double *)dd_local;
}

Assistant:

double *
Cudd_CofMinterm(
  DdManager * dd,
  DdNode * node)
{
    st__table    *table;
    double      *values;
    double      *result = NULL;
    int         i, firstLevel;

#ifdef DD_STATS
    long startTime;
    startTime = util_cpu_time();
    num_calls = 0;
    table_mem = sizeof( st__table);
#endif

    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) {
        (void) fprintf(dd->err,
                       "out-of-memory, couldn't measure DD cofactors.\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    size = dd->size;
    values = ddCofMintermAux(dd, node, table);
    if (values != NULL) {
        result = ABC_ALLOC(double,size + 1);
        if (result != NULL) {
#ifdef DD_STATS
            table_mem += (size + 1) * sizeof(double);
#endif
            if (Cudd_IsConstant(node))
                firstLevel = 1;
            else
                firstLevel = cuddI(dd,Cudd_Regular(node)->index);
            for (i = 0; i < size; i++) {
                if (i >= cuddI(dd,Cudd_Regular(node)->index)) {
                    result[dd->invperm[i]] = values[i - firstLevel];
                } else {
                    result[dd->invperm[i]] = values[size - firstLevel];
                }
            }
            result[size] = values[size - firstLevel];
        } else {
            dd->errorCode = CUDD_MEMORY_OUT;
        }
    }

#ifdef DD_STATS
    table_mem += table->num_bins * sizeof( st__table_entry *);
#endif
    if (Cudd_Regular(node)->ref == 1) ABC_FREE(values);
    st__foreach(table, cuddStCountfree, NULL);
    st__free_table(table);
#ifdef DD_STATS
    (void) fprintf(dd->out,"Number of calls: %d\tTable memory: %d bytes\n",
                  num_calls, table_mem);
    (void) fprintf(dd->out,"Time to compute measures: %s\n",
                  util_print_time(util_cpu_time() - startTime));
#endif
    if (result == NULL) {
        (void) fprintf(dd->out,
                       "out-of-memory, couldn't measure DD cofactors.\n");
        dd->errorCode = CUDD_MEMORY_OUT;
    }
    return(result);

}